

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_insert.cpp
# Opt level: O2

unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true> __thiscall
duckdb::Transformer::TransformInsert(Transformer *this,PGInsertStmt *stmt)

{
  uint uVar1;
  PGList *list;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  string *psVar3;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  PGWithClause *de_with_clause;
  pointer pIVar7;
  PGResTarget *pPVar8;
  ParserException *this_00;
  InternalException *this_01;
  InsertColumnOrder IVar9;
  long in_RDX;
  undefined8 *puVar10;
  PGOnConflictActionAlias type;
  PGInsertStmt *pPVar11;
  allocator local_b1;
  undefined1 local_b0 [32];
  QualifiedName qname;
  
  make_uniq<duckdb::InsertStatement>();
  if (*(pointer *)(in_RDX + 0x38) != (pointer)0x0) {
    qname.catalog._M_dataplus._M_p = *(pointer *)(in_RDX + 0x38);
    de_with_clause =
         optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                   ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)&qname);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    TransformCTE((Transformer *)stmt,de_with_clause,&pIVar7->cte_map);
  }
  puVar10 = *(undefined8 **)(in_RDX + 0x10);
  if (puVar10 != (undefined8 *)0x0) {
    while (puVar10 = (undefined8 *)puVar10[1], puVar10 != (undefined8 *)0x0) {
      qname.catalog._M_dataplus._M_p = (pointer)*puVar10;
      pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
               ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                             *)this);
      pPVar8 = optional_ptr<duckdb_libpgquery::PGResTarget,_true>::operator->
                         ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)&qname);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pIVar7->columns,&pPVar8->name);
    }
  }
  list = *(PGList **)(in_RDX + 0x30);
  if (list != (PGList *)0x0) {
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    TransformExpressionList((Transformer *)stmt,list,&pIVar7->returning_list);
  }
  if (*(long *)(in_RDX + 0x18) == 0) {
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    pIVar7->default_values = true;
  }
  else {
    TransformSelectStmt((Transformer *)&qname,(PGNode *)stmt,SUB81(*(long *)(in_RDX + 0x18),0));
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    _Var6 = qname.catalog._M_dataplus;
    qname.catalog._M_dataplus._M_p = (pointer)0x0;
    _Var2._M_head_impl =
         (pIVar7->select_statement).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pIVar7->select_statement).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
         (SelectStatement *)_Var6._M_p;
    if (_Var2._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
      if (qname.catalog._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)qname.catalog._M_dataplus._M_p + 8))();
      }
    }
  }
  TransformQualifiedName(&qname,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
           operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pIVar7->table);
  pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
           operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                       *)this);
  type = (int)&qname + 0x20;
  ::std::__cxx11::string::_M_assign((string *)&pIVar7->schema);
  psVar3 = *(string **)(in_RDX + 0x28);
  if (psVar3 != (string *)0x0) {
    if (*(int *)(in_RDX + 0x20) != 0) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_b0,
                 "You can not provide both OR REPLACE|IGNORE and an ON CONFLICT clause, please remove the first if you want to have more granual control"
                 ,&local_b1);
      ParserException::ParserException(this_00,(string *)local_b0);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
    operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                *)this);
    TransformOnConflictClause((Transformer *)local_b0,(PGOnConflictClause *)stmt,psVar3);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar5 = local_b0._0_8_;
    local_b0._0_8_ =
         (__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)0x0;
    ::std::__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>::
    reset((__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_> *)
          &pIVar7->on_conflict_info,(pointer)uVar5);
    ::std::unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_> *)
                local_b0);
    pPVar11 = stmt;
    TransformRangeVar((Transformer *)local_b0,(PGRangeVar *)stmt);
    type = (PGOnConflictActionAlias)pPVar11;
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar5 = local_b0._0_8_;
    local_b0._0_8_ =
         (__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)0x0;
    _Var4._M_head_impl =
         (pIVar7->table_ref).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pIVar7->table_ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar5;
    if (_Var4._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
      if ((__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)
          local_b0._0_8_ !=
          (__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)0x0
         ) {
        (**(code **)(*(long *)local_b0._0_8_ + 8))();
      }
    }
  }
  uVar1 = *(uint *)(in_RDX + 0x20);
  if (uVar1 != 0) {
    unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
    operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                *)this);
    DummyOnConflictClause((Transformer *)local_b0,type,(string *)(ulong)uVar1);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar5 = local_b0._0_8_;
    local_b0._0_8_ =
         (__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)0x0;
    ::std::__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>::
    reset((__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_> *)
          &pIVar7->on_conflict_info,(pointer)uVar5);
    ::std::unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_> *)
                local_b0);
    TransformRangeVar((Transformer *)local_b0,(PGRangeVar *)stmt);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar5 = local_b0._0_8_;
    local_b0._0_8_ =
         (__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)0x0;
    _Var4._M_head_impl =
         (pIVar7->table_ref).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pIVar7->table_ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar5;
    if (_Var4._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
      if ((__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)
          local_b0._0_8_ !=
          (__uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)0x0
         ) {
        (**(code **)(*(long *)local_b0._0_8_ + 8))();
      }
    }
  }
  if (*(int *)(in_RDX + 0x44) == 1) {
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    IVar9 = INSERT_BY_NAME;
  }
  else {
    if (*(int *)(in_RDX + 0x44) != 0) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_b0,"Unrecognized insert column order in TransformInsert",&local_b1)
      ;
      InternalException::InternalException(this_01,(string *)local_b0);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    IVar9 = INSERT_BY_POSITION;
  }
  pIVar7->column_order = IVar9;
  pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
           operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pIVar7->catalog);
  QualifiedName::~QualifiedName(&qname);
  return (unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>_>)
         (unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>_>)this;
}

Assistant:

unique_ptr<InsertStatement> Transformer::TransformInsert(duckdb_libpgquery::PGInsertStmt &stmt) {
	auto result = make_uniq<InsertStatement>();
	if (stmt.withClause) {
		TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), result->cte_map);
	}

	// first check if there are any columns specified
	if (stmt.cols) {
		for (auto c = stmt.cols->head; c != nullptr; c = lnext(c)) {
			auto target = PGPointerCast<duckdb_libpgquery::PGResTarget>(c->data.ptr_value);
			result->columns.emplace_back(target->name);
		}
	}

	// Grab and transform the returning columns from the parser.
	if (stmt.returningList) {
		TransformExpressionList(*stmt.returningList, result->returning_list);
	}
	if (stmt.selectStmt) {
		result->select_statement = TransformSelectStmt(*stmt.selectStmt, false);
	} else {
		result->default_values = true;
	}

	auto qname = TransformQualifiedName(*stmt.relation);
	result->table = qname.name;
	result->schema = qname.schema;

	if (stmt.onConflictClause) {
		if (stmt.onConflictAlias != duckdb_libpgquery::PG_ONCONFLICT_ALIAS_NONE) {
			// OR REPLACE | OR IGNORE are shorthands for the ON CONFLICT clause
			throw ParserException("You can not provide both OR REPLACE|IGNORE and an ON CONFLICT clause, please remove "
			                      "the first if you want to have more granual control");
		}
		result->on_conflict_info = TransformOnConflictClause(stmt.onConflictClause, result->schema);
		result->table_ref = TransformRangeVar(*stmt.relation);
	}
	if (stmt.onConflictAlias != duckdb_libpgquery::PG_ONCONFLICT_ALIAS_NONE) {
		D_ASSERT(!stmt.onConflictClause);
		result->on_conflict_info = DummyOnConflictClause(stmt.onConflictAlias, result->schema);
		result->table_ref = TransformRangeVar(*stmt.relation);
	}
	switch (stmt.insert_column_order) {
	case duckdb_libpgquery::PG_INSERT_BY_POSITION:
		result->column_order = InsertColumnOrder::INSERT_BY_POSITION;
		break;
	case duckdb_libpgquery::PG_INSERT_BY_NAME:
		result->column_order = InsertColumnOrder::INSERT_BY_NAME;
		break;
	default:
		throw InternalException("Unrecognized insert column order in TransformInsert");
	}
	result->catalog = qname.catalog;
	return result;
}